

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

void __thiscall Function::~Function(Function *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Function *pFVar3;
  pointer pcVar4;
  pointer ppFVar5;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0015d048;
  pFVar3 = this->xLeft;
  if (pFVar3 != (Function *)0x0) {
    piVar1 = &pFVar3->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar3->super_Physical)._vptr_Physical[1])();
    }
  }
  pFVar3 = this->xRight;
  if (pFVar3 != (Function *)0x0) {
    piVar1 = &pFVar3->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar3->super_Physical)._vptr_Physical[1])();
    }
  }
  pFVar3 = this->xPlus;
  if (pFVar3 != (Function *)0x0) {
    piVar1 = &pFVar3->functionUseCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      (*(pFVar3->super_Physical)._vptr_Physical[1])();
    }
  }
  pcVar4 = (this->sName)._M_dataplus._M_p;
  paVar2 = &(this->sName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  ppFVar5 = (this->vParents).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar5 != (pointer)0x0) {
    operator_delete(ppFVar5,(long)(this->vParents).
                                  super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar5)
    ;
  }
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Function::~Function()
{
	if (xLeft) {
		xLeft->functionUseCount--;
		if (xLeft->functionUseCount)
			delete xLeft;
	}
	if (xRight) {
		xRight->functionUseCount--;
		if (xRight->functionUseCount)
			delete xRight;
	}
	if (xPlus) {
		xPlus->functionUseCount--;
		if (xPlus->functionUseCount)
			delete xPlus;
	}
}